

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall ExprTest_PLTerm_Test::ExprTest_PLTerm_Test(ExprTest_PLTerm_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018efb8;
  return;
}

Assistant:

TEST_F(ExprTest, PLTerm) {
  mp::PLTerm e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  ExprFactory::PLTermBuilder builder = factory_.BeginPLTerm(2);
  builder.AddSlope(11);
  builder.AddBreakpoint(111);
  builder.AddSlope(22);
  builder.AddBreakpoint(222);
  builder.AddSlope(33);
  auto var = factory_.MakeVariable(42);
  e = factory_.EndPLTerm(builder, var);
  EXPECT_EQ(expr::PLTERM, e.kind());
  EXPECT_EQ(2, e.num_breakpoints());
  EXPECT_EQ(3, e.num_slopes());
  EXPECT_EQ(11, e.slope(0));
  EXPECT_EQ(22, e.slope(1));
  EXPECT_EQ(33, e.slope(2));
  EXPECT_ASSERT(e.slope(-1), "index out of bounds");
  EXPECT_ASSERT(e.slope(3), "index out of bounds");
  EXPECT_EQ(111, e.breakpoint(0));
  EXPECT_EQ(222, e.breakpoint(1));
  EXPECT_ASSERT(e.breakpoint(-1), "index out of bounds");
  EXPECT_ASSERT(e.breakpoint(2), "index out of bounds");
  EXPECT_EQ(var, e.arg());
  EXPECT_ASSERT(factory_.BeginPLTerm(0), "invalid number of breakpoints");
  builder = factory_.BeginPLTerm(1);
  builder.AddSlope(0);
  builder.AddBreakpoint(0);
  builder.AddSlope(1);
  auto arg = factory_.MakeCommonExpr(0);
  e = factory_.EndPLTerm(builder, arg);
  EXPECT_EQ(arg, e.arg());
}